

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lattice.hpp
# Opt level: O3

void __thiscall OpenMD::CubicLattice::CubicLattice(CubicLattice *this)

{
  Vector3d *pVVar1;
  undefined8 uVar2;
  
  pVVar1 = &(this->super_Lattice).origin;
  (this->super_Lattice).cellSitesOrt.
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Lattice).cellSitesOrt.
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Lattice).cellSitesPos.
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Lattice).cellSitesPos.
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Lattice).origin.super_Vector<double,_3U>.data_[2] = 0.0;
  (this->super_Lattice).cellSitesPos.
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Lattice).origin.super_Vector<double,_3U>.data_[0] = 0.0;
  (this->super_Lattice).origin.super_Vector<double,_3U>.data_[1] = 0.0;
  (this->super_Lattice).cellSitesOrt.
  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (pVVar1 != (Vector3d *)OpenMD::V3Zero) {
    (this->super_Lattice).origin.super_Vector<double,_3U>.data_[2] = (double)OpenMD::V3Zero._16_8_;
    uVar2 = OpenMD::V3Zero._8_8_;
    (pVVar1->super_Vector<double,_3U>).data_[0] = (double)OpenMD::V3Zero._0_8_;
    (this->super_Lattice).origin.super_Vector<double,_3U>.data_[1] = (double)uVar2;
  }
  (this->super_Lattice)._vptr_Lattice = (_func_int **)&PTR__Lattice_00300d98;
  (this->super_Lattice).cellLen.super_Vector<double,_3U>.data_[0] = 1.0;
  (this->super_Lattice).cellLen.super_Vector<double,_3U>.data_[1] = 1.0;
  (this->super_Lattice).cellLen.super_Vector<double,_3U>.data_[2] = 1.0;
  this->latticeParam = 1.0;
  return;
}

Assistant:

Lattice() { setOrigin(V3Zero); }